

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O3

void __thiscall
ExchCXX::detail::LibxcKernelImpl::LibxcKernelImpl(LibxcKernelImpl *this,int kern,int spin_polar)

{
  int iVar1;
  runtime_error *this_00;
  
  (this->super_XCKernelImpl)._vptr_XCKernelImpl = (_func_int **)&PTR__LibxcKernelImpl_010f3db0;
  this->polar_ = spin_polar;
  this->initialized_ = false;
  iVar1 = xc_func_init(&this->kernel_,kern,spin_polar);
  if (iVar1 == 0) {
    this->initialized_ = true;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Libxc Kernel Init Failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

LibxcKernelImpl::LibxcKernelImpl( 
  const int kern, 
  const int spin_polar
) : polar_(spin_polar) {

  // Initialize XC Kernel using Libxc
  int info = xc_func_init( &kernel_, kern, spin_polar );
  if( info )
    throw std::runtime_error("Libxc Kernel Init Failed");

  initialized_ = true;
}